

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

bool __thiscall smf::Options::getBoolean(Options *this,string *optionName)

{
  undefined1 uVar1;
  uint uVar2;
  
  uVar2 = getRegIndex(this,optionName);
  if ((int)uVar2 < 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (this->m_optionRegister).
            super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar2]->m_modifiedQ;
  }
  return (bool)uVar1;
}

Assistant:

bool Options::getBoolean(const std::string& optionName) {
	int index = getRegIndex(optionName);
	if (index < 0) {
		return 0;
	}
	return m_optionRegister[index]->isModified();
}